

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginPopupContextItem(char *str_id,int mouse_button)

{
  bool bVar1;
  ImGuiID id;
  
  if (str_id == (char *)0x0) {
    id = (GImGui->CurrentWindow->DC).LastItemId;
  }
  else {
    id = ImGuiWindow::GetID(GImGui->CurrentWindow,str_id,(char *)0x0);
  }
  if ((GImGui->IO).MouseReleased[mouse_button] == true) {
    bVar1 = IsItemHovered(8);
    if (bVar1) {
      OpenPopupEx(id);
    }
  }
  bVar1 = BeginPopupEx(id,0x141);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextItem(const char* str_id, int mouse_button)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    ImGuiID id = str_id ? window->GetID(str_id) : window->DC.LastItemId; // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
    IM_ASSERT(id != 0);                                                  // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        OpenPopupEx(id);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoSavedSettings);
}